

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O1

int __thiscall soplex::SPxParMultPR<double>::selectLeave(SPxParMultPR<double> *this)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  uVar5 = (ulong)(pSVar2->thecovectors->set).thenum;
  if (0 < (long)uVar5) {
    dVar6 = -(this->super_SPxPricer<double>).thetolerance;
    uVar4 = 0xffffffff;
    do {
      dVar1 = (pSVar2->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 - 1];
      if (dVar1 < dVar6) {
        uVar4 = uVar5 - 1 & 0xffffffff;
        dVar6 = dVar1;
      }
      bVar3 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    return (int)uVar4;
  }
  return -1;
}

Assistant:

int SPxParMultPR<R>::selectLeave()
{
   int i, n;
   R x;
   R best = -this->thetolerance;
   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   assert(this->thesolver != nullptr);
   n = -1;

   for(i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->fTest()[i];

      // x *= EQ_PREF * (1 + (up[i] == low[i]));
      if(x < best)
      {
         n = i;
         best = this->thesolver->fTest()[i];
      }
   }

   return n;
}